

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsMeshValidate(FmsMesh mesh)

{
  FmsInt *pFVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  char **ppcVar5;
  FmsComponent *ppFVar6;
  FmsComponent pFVar7;
  FmsInt FVar8;
  _FmsPart_private *p_Var9;
  FmsDomain pFVar10;
  char *__s1;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int unaff_EBP;
  FmsInt FVar14;
  ulong uVar15;
  FmsInt FVar16;
  bool bVar17;
  bool bVar18;
  
  if (mesh == (FmsMesh)0x0) {
    return 1;
  }
  pFVar1 = mesh->domain_offsets;
  iVar11 = 2;
  if (*pFVar1 == 0) {
    uVar2 = mesh->num_domain_names;
    iVar11 = 3;
    if ((pFVar1[uVar2] == mesh->num_domains) &&
       (iVar11 = 4, mesh->partition_id < mesh->num_partitions)) {
      uVar3 = 0;
      iVar11 = unaff_EBP;
      do {
        uVar13 = uVar3;
        if (uVar13 == uVar2) break;
        uVar3 = pFVar1[uVar13];
        uVar4 = pFVar1[uVar13 + 1];
        bVar17 = uVar3 < uVar4;
        if (bVar17) {
          uVar15 = uVar3;
          do {
            if (mesh->domains[uVar15]->name == mesh->domain_names[uVar13]) {
              bVar18 = uVar15 == mesh->domains[uVar15]->id + uVar3;
              if (!bVar18) {
                iVar11 = 6;
              }
            }
            else {
              iVar11 = 5;
              bVar18 = false;
            }
            if (!bVar18) break;
            uVar15 = uVar15 + 1;
            bVar17 = uVar15 < uVar4;
          } while (uVar15 != uVar4);
        }
        uVar3 = uVar13 + 1;
      } while (!bVar17);
      if (uVar2 <= uVar13) {
        uVar3 = mesh->num_comps;
        bVar17 = uVar3 != 0;
        if (bVar17) {
          ppcVar5 = mesh->domain_names;
          ppFVar6 = mesh->comps;
          FVar14 = 0;
          do {
            pFVar7 = ppFVar6[FVar14];
            if (pFVar7->id == FVar14) {
              if (pFVar7->dim == 0x7f) {
                iVar11 = 8;
                goto LAB_00104cd0;
              }
              FVar8 = pFVar7->num_parts;
              bVar18 = FVar8 == 0;
              if (!bVar18) {
                p_Var9 = pFVar7->parts;
                FVar16 = 0;
                do {
                  if (uVar2 != 0) {
                    pFVar10 = p_Var9[FVar16].domain;
                    __s1 = pFVar10->name;
                    uVar13 = 0;
                    do {
                      iVar12 = strcmp(__s1,ppcVar5[uVar13]);
                      if (iVar12 == 0) {
                        if (pFVar10->id < pFVar1[uVar13 + 1] - pFVar1[uVar13]) {
                          bVar18 = mesh->domains[pFVar1[uVar13] + pFVar10->id] == pFVar10;
                          if (!bVar18) {
                            iVar11 = 0xb;
                          }
                        }
                        else {
                          iVar11 = 10;
                          bVar18 = false;
                        }
                        goto LAB_00104d53;
                      }
                      uVar13 = uVar13 + 1;
                    } while (uVar2 != uVar13);
                  }
                  bVar18 = false;
                  iVar11 = 9;
LAB_00104d53:
                  if (!bVar18) {
                    bVar18 = false;
                    goto LAB_00104cd2;
                  }
                  FVar16 = FVar16 + 1;
                } while (FVar16 != FVar8);
                bVar18 = true;
              }
            }
            else {
              iVar11 = 7;
LAB_00104cd0:
              bVar18 = false;
            }
LAB_00104cd2:
            if (!bVar18) break;
            FVar14 = FVar14 + 1;
            bVar17 = FVar14 < uVar3;
          } while (FVar14 != uVar3);
        }
        if (!bVar17) {
          if (mesh->num_tags == 0) {
            iVar11 = 0;
          }
          else {
            FVar14 = 0;
            iVar12 = iVar11;
            do {
              pFVar7 = mesh->tags[FVar14]->comp;
              uVar2 = pFVar7->id;
              if (uVar2 < uVar3) {
                bVar17 = mesh->comps[uVar2] == pFVar7;
                if (!bVar17) {
                  iVar12 = 0xd;
                }
              }
              else {
                iVar12 = 0xc;
                bVar17 = false;
              }
              if (!bVar17) {
                return iVar12;
              }
              FVar14 = FVar14 + 1;
              iVar11 = 0;
            } while (mesh->num_tags != FVar14);
          }
        }
      }
    }
  }
  return iVar11;
}

Assistant:

int FmsMeshValidate(FmsMesh mesh) {
  if (!mesh) { E_RETURN(1); }
  // Perform some validation
  if (mesh->domain_offsets[0] != 0) { E_RETURN(2); }
  if (mesh->domain_offsets[mesh->num_domain_names] != mesh->num_domains) {
    E_RETURN(3);
  }
  if (mesh->partition_id >= mesh->num_partitions) { E_RETURN(4); }
  // Check domains for consistency
  for (FmsInt name_id = 0; name_id < mesh->num_domain_names; name_id++) {
    const FmsInt name_start = mesh->domain_offsets[name_id];
    const FmsInt name_end = mesh->domain_offsets[name_id+1];
    for (FmsInt domain_id = name_start; domain_id < name_end; domain_id++) {
      FmsDomain domain = mesh->domains[domain_id];
      if (domain->name != mesh->domain_names[name_id]) { E_RETURN(5); }
      if (name_start + domain->id != domain_id) { E_RETURN(6); }
      // TODO: Check that all side ids are in the expected ranges
    }
  }
  // Check that all components use domains from the same mesh
  char **domain_names = mesh->domain_names;
  for (FmsInt comp_id = 0; comp_id < mesh->num_comps; comp_id++) {
    FmsComponent comp = mesh->comps[comp_id];
    if (comp->id != comp_id) { E_RETURN(7); }
    if (comp->dim == FMS_INVALID_DIM) { E_RETURN(8); }
    for (FmsInt part_id = 0; part_id < comp->num_parts; part_id++) {
      FmsDomain domain = comp->parts[part_id].domain;
      FmsInt domain_name_id = 0;
      for ( ; 1; domain_name_id++) {
        if (domain_name_id == mesh->num_domain_names) { E_RETURN(9); }
        if (strcmp(domain->name, domain_names[domain_name_id]) == 0) { break; }
      }
      FmsInt b_offset = mesh->domain_offsets[domain_name_id];
      FmsInt num_domains = mesh->domain_offsets[domain_name_id+1] - b_offset;
      if (domain->id >= num_domains) { E_RETURN(10); }
      if (mesh->domains[b_offset + domain->id] != domain) { E_RETURN(11); }
    }
  }
  // Check that all tags use components from the same mesh
  for (FmsInt tag_id = 0; tag_id < mesh->num_tags; tag_id++) {
    FmsTag tag = mesh->tags[tag_id];
    FmsInt comp_id = tag->comp->id;
    if (comp_id >= mesh->num_comps) { E_RETURN(12); }
    if (mesh->comps[comp_id] != tag->comp) { E_RETURN(13); }
  }
  return 0;
}